

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_symbol_codec.cpp
# Opt level: O0

void __thiscall lzham::symbol_codec::clear(symbol_codec *this)

{
  vector<lzham::symbol_codec::output_symbol> *in_RDI;
  
  in_RDI->m_p = (output_symbol *)0x0;
  *(undefined8 *)&in_RDI->m_size = 0;
  in_RDI[1].m_p = (output_symbol *)0x0;
  *(undefined8 *)&in_RDI[1].m_size = 0;
  *(undefined8 *)&in_RDI[3].m_size = 0;
  *(undefined4 *)&in_RDI[4].m_p = 0;
  *(undefined4 *)((long)&in_RDI[4].m_p + 4) = 0;
  *(undefined4 *)&in_RDI[10].m_p = 0;
  in_RDI[7].m_size = 0;
  in_RDI[7].m_capacity = 0;
  *(undefined4 *)&in_RDI[8].m_p = 0;
  *(undefined4 *)((long)&in_RDI[8].m_p + 4) = 0;
  in_RDI[8].m_size = 0;
  vector<unsigned_char>::clear((vector<unsigned_char> *)in_RDI);
  vector<unsigned_char>::clear((vector<unsigned_char> *)in_RDI);
  vector<lzham::symbol_codec::output_symbol>::clear(in_RDI);
  return;
}

Assistant:

void symbol_codec::clear()
   {
      m_pDecode_buf = NULL;
      m_pDecode_buf_next = NULL;
      m_pDecode_buf_end = NULL;
      m_decode_buf_size = 0;

      m_bit_buf = 0;
      m_bit_count = 0;
      m_total_model_updates = 0;
      m_mode = cNull;
      m_total_bits_written = 0;

      m_arith_base = 0;
      m_arith_value = 0;
      m_arith_length = 0;
      m_arith_total_bits = 0;

      m_output_buf.clear();
      m_arith_output_buf.clear();
      m_output_syms.clear();
   }